

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

uint openjtalk_getFperiod(OpenJTalk *oj)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  double res;
  _Bool error;
  _Bool local_11;
  undefined8 *local_10;
  uint local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0xcf) = 0;
    local_10 = in_RDI;
    sVar1 = Open_JTalk_get_fperiod((Open_JTalk *)*in_RDI,&local_11);
    auVar4._8_4_ = (int)(sVar1 >> 0x20);
    auVar4._0_8_ = sVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
    if ((local_11 & 1U) == 0) {
      uVar2 = (ulong)dVar3;
      local_10[200] = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      local_4 = (uint)local_10[200];
    }
    else {
      *(undefined4 *)(local_10 + 0xcf) = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getFperiod(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_fperiod(oj->open_jtalk, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}
	oj->fperiod = res;
	return oj->fperiod;
}